

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O3

void __thiscall
llvm::StringMap<llbuild::core::KeyID,_llvm::MallocAllocator>::~StringMap
          (StringMap<llbuild::core::KeyID,_llvm::MallocAllocator> *this)

{
  StringMapEntryBase *__ptr;
  ulong uVar1;
  ulong uVar2;
  
  if (((this->super_StringMapImpl).NumItems != 0) &&
     (uVar1 = (ulong)(this->super_StringMapImpl).NumBuckets, uVar1 != 0)) {
    uVar2 = 0;
    do {
      __ptr = (this->super_StringMapImpl).TheTable[uVar2];
      if ((__ptr != (StringMapEntryBase *)0xfffffffffffffff8) &&
         (__ptr != (StringMapEntryBase *)0x0)) {
        free(__ptr);
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  free((this->super_StringMapImpl).TheTable);
  return;
}

Assistant:

~StringMap() {
    // Delete all the elements in the map, but don't reset the elements
    // to default values.  This is a copy of clear(), but avoids unnecessary
    // work not required in the destructor.
    if (!empty()) {
      for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
        StringMapEntryBase *Bucket = TheTable[I];
        if (Bucket && Bucket != getTombstoneVal()) {
          static_cast<MapEntryTy*>(Bucket)->Destroy(Allocator);
        }
      }
    }
    free(TheTable);
  }